

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_bool spvc_compiler_msl_is_shader_output_used(spvc_compiler compiler,uint location)

{
  spvc_context_s *this;
  CompilerMSL *this_00;
  CompilerMSL *msl;
  allocator local_41;
  string local_40;
  uint local_1c;
  spvc_compiler psStack_18;
  uint location_local;
  spvc_compiler compiler_local;
  
  local_1c = location;
  psStack_18 = compiler;
  if (compiler->backend == SPVC_BACKEND_MSL) {
    this_00 = (CompilerMSL *)
              std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
              get(&compiler->compiler);
    compiler_local._7_1_ = spirv_cross::CompilerMSL::is_msl_shader_output_used(this_00,local_1c);
  }
  else {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"MSL function used on a non-MSL backend.",&local_41);
    spvc_context_s::report_error(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    compiler_local._7_1_ = false;
  }
  return compiler_local._7_1_;
}

Assistant:

spvc_bool spvc_compiler_msl_is_shader_output_used(spvc_compiler compiler, unsigned location)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_FALSE;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	return msl.is_msl_shader_output_used(location) ? SPVC_TRUE : SPVC_FALSE;
#else
	(void)location;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_FALSE;
#endif
}